

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O1

WatchID __thiscall
efsw::FileWatcherGeneric::addWatch
          (FileWatcherGeneric *this,string *directory,FileWatchListener *watcher,bool recursive,
          vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options)

{
  pointer *pppWVar1;
  pointer pcVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  Error EVar5;
  WatcherGeneric *this_00;
  WatchID WVar6;
  _Alloc_hider _Var7;
  long id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string dir;
  WatcherGeneric *pWatch;
  string curPath;
  string link;
  FileInfo fi;
  string local_1a0;
  WatcherGeneric *local_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  FileInfo local_78;
  
  pcVar2 = (directory->_M_dataplus)._M_p;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar2,pcVar2 + directory->_M_string_length);
  FileSystem::dirAddSlashAtEnd(&local_1a0);
  FileInfo::FileInfo(&local_78,&local_1a0);
  bVar3 = FileInfo::isDirectory(&local_78);
  if (!bVar3) {
    paVar8 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_1a0._M_dataplus._M_p,
               local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
    EVar5 = Errors::Log::createLastError(FileNotFound,&local_98);
    WVar6 = (WatchID)EVar5;
    _Var7._M_p = local_98._M_dataplus._M_p;
    goto LAB_001063b1;
  }
  bVar3 = FileInfo::isReadable(&local_78);
  if (!bVar3) {
    paVar8 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_1a0._M_dataplus._M_p,
               local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
    EVar5 = Errors::Log::createLastError(FileNotReadable,&local_b8);
    WVar6 = (WatchID)EVar5;
    _Var7._M_p = local_b8._M_dataplus._M_p;
    goto LAB_001063b1;
  }
  iVar4 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&local_1a0);
  if ((char)iVar4 != '\0') {
    paVar8 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_1a0._M_dataplus._M_p,
               local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
    EVar5 = Errors::Log::createLastError(FileRepeated,&local_d8);
    WVar6 = (WatchID)EVar5;
    _Var7._M_p = local_d8._M_dataplus._M_p;
    goto LAB_001063b1;
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_1a0._M_dataplus._M_p,
             local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
  FileSystem::getLinkRealPath(&local_158,&local_f8,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_158);
  if (iVar4 == 0) {
LAB_001062d0:
    id = this->mLastWatchID + 1;
    this->mLastWatchID = id;
    this_00 = (WatcherGeneric *)operator_new(0x70);
    WatcherGeneric::WatcherGeneric
              (this_00,id,&local_1a0,watcher,&this->super_FileWatcherImpl,recursive);
    local_180 = this_00;
    Mutex::lock(&this->mWatchesLock);
    __position._M_current =
         (this->mWatches).
         super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->mWatches).
        super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<efsw::WatcherGeneric*,std::allocator<efsw::WatcherGeneric*>>::
      _M_realloc_insert<efsw::WatcherGeneric*const&>
                ((vector<efsw::WatcherGeneric*,std::allocator<efsw::WatcherGeneric*>> *)
                 &this->mWatches,__position,&local_180);
    }
    else {
      *__position._M_current = local_180;
      pppWVar1 = &(this->mWatches).
                  super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppWVar1 = *pppWVar1 + 1;
    }
    WVar6 = (local_180->super_Watcher).ID;
    Mutex::unlock(&this->mWatchesLock);
  }
  else {
    iVar4 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&local_158);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[9])(this,&local_178,&local_158);
      if ((char)iVar4 != '\0') {
        std::__cxx11::string::_M_assign((string *)&local_1a0);
        goto LAB_001062d0;
      }
      paVar8 = &local_138.field_2;
      local_138._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_1a0._M_dataplus._M_p,
                 local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
      EVar5 = Errors::Log::createLastError(FileOutOfScope,&local_138);
      _Var7._M_p = local_138._M_dataplus._M_p;
    }
    else {
      paVar8 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_1a0._M_dataplus._M_p,
                 local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
      EVar5 = Errors::Log::createLastError(FileRepeated,&local_118);
      _Var7._M_p = local_118._M_dataplus._M_p;
    }
    WVar6 = (WatchID)EVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p != paVar8) {
      operator_delete(_Var7._M_p);
    }
  }
  paVar8 = &local_178.field_2;
  _Var7._M_p = local_178._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
    _Var7._M_p = local_178._M_dataplus._M_p;
  }
LAB_001063b1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar8) {
    operator_delete(_Var7._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
    operator_delete(local_78.Filepath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  return WVar6;
}

Assistant:

WatchID FileWatcherGeneric::addWatch( const std::string& directory, FileWatchListener* watcher,
									  bool recursive, const std::vector<WatcherOption>& options ) {
	std::string dir( directory );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() ) {
		return Errors::Log::createLastError( Errors::FileNotFound, dir );
	} else if ( !fi.isReadable() ) {
		return Errors::Log::createLastError( Errors::FileNotReadable, dir );
	} else if ( pathInWatches( dir ) ) {
		return Errors::Log::createLastError( Errors::FileRepeated, dir );
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );

	if ( "" != link ) {
		if ( pathInWatches( link ) ) {
			return Errors::Log::createLastError( Errors::FileRepeated, dir );
		} else if ( !linkAllowed( curPath, link ) ) {
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		} else {
			dir = link;
		}
	}

	mLastWatchID++;

	WatcherGeneric* pWatch = new WatcherGeneric( mLastWatchID, dir, watcher, this, recursive );

	Lock lock( mWatchesLock );
	mWatches.push_back( pWatch );

	return pWatch->ID;
}